

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O2

bool __thiscall
Rml::BaseXMLParser::FindString(BaseXMLParser *this,char *string,String *data,bool escape_brackets)

{
  char cVar1;
  char c;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  undefined7 in_register_00000009;
  char previous;
  bool bVar5;
  bool in_brackets;
  bool in_string;
  undefined4 local_44;
  char *local_40;
  String *local_38;
  
  local_44 = (undefined4)CONCAT71(in_register_00000009,escape_brackets);
  cVar1 = *string;
  in_brackets = false;
  in_string = false;
  uVar4 = this->xml_index;
  previous = '\0';
  local_40 = string;
  local_38 = data;
  while( true ) {
    bVar5 = uVar4 < (this->xml_source)._M_string_length;
    if (!bVar5) {
      return bVar5;
    }
    c = Look(this);
    if (c == '\n') {
      this->line_number = this->line_number + 1;
    }
    if (((char)local_44 != '\0') &&
       (pcVar3 = XMLParseTools::ParseDataBrackets(&in_brackets,&in_string,c,previous),
       pcVar3 != (char *)0x0)) break;
    if (((c == cVar1) && (in_brackets == false)) && (bVar2 = PeekString(this,local_40,true), bVar2))
    {
      return bVar5;
    }
    ::std::__cxx11::string::push_back((char)local_38);
    uVar4 = this->xml_index + 1;
    this->xml_index = uVar4;
    previous = c;
  }
  Log::Message(LT_WARNING,"XML parse error. %s",pcVar3);
  return false;
}

Assistant:

bool BaseXMLParser::FindString(const char* string, String& data, bool escape_brackets)
{
	const char first_char = string[0];
	bool in_brackets = false;
	bool in_string = false;
	char previous = 0;

	while (!AtEnd())
	{
		const char c = Look();

		// Count line numbers
		if (c == '\n')
		{
			line_number++;
		}

		if (escape_brackets)
		{
			const char* error_str = XMLParseTools::ParseDataBrackets(in_brackets, in_string, c, previous);
			if (error_str)
			{
				Log::Message(Log::LT_WARNING, "XML parse error. %s", error_str);
				return false;
			}
		}

		if (c == first_char && !in_brackets && PeekString(string))
		{
			return true;
		}

		data += c;
		previous = c;
		Next();
	}

	return false;
}